

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_sizeof(lua_State *L)

{
  CTState *cts_00;
  CTypeID id_00;
  CTSize nelem;
  CType *ct_00;
  bool bVar1;
  CTSize local_6c;
  CType *ct;
  CTSize sz;
  CTypeID id;
  CTState *cts;
  lua_State *L_local;
  CTState *cts_1;
  
  cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
  cts_00->L = L;
  id_00 = ffi_checkctype(L,cts_00,(TValue *)0x0);
  bVar1 = false;
  if ((int)(L->base->field_4).it >> 0xf == -0xb) {
    bVar1 = (*(byte *)((L->base->u64 & 0x7fffffffffff) + 8) & 0x80) != 0;
  }
  if (bVar1) {
    ct._0_4_ = *(CTSize *)((L->base->u64 & 0x7fffffffffff) - 4);
  }
  else {
    ct_00 = lj_ctype_rawref(cts_00,id_00);
    if ((ct_00->info & 0xd0100000) == 0x10100000) {
      nelem = ffi_checkint(L,2);
      ct._0_4_ = lj_ctype_vlsize(cts_00,ct_00,nelem);
    }
    else {
      if (ct_00->info >> 0x1c < 6) {
        local_6c = ct_00->size;
      }
      else {
        local_6c = 0xffffffff;
      }
      ct._0_4_ = local_6c;
    }
    if ((CTSize)ct == 0xffffffff) {
      L->top[-1].u64 = 0xffffffffffffffff;
      return 1;
    }
  }
  L->top[-1].n = (double)(int)(CTSize)ct;
  return 1;
}

Assistant:

LJLIB_CF(ffi_sizeof)	LJLIB_REC(ffi_xof FF_ffi_sizeof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CTSize sz;
  if (LJ_UNLIKELY(tviscdata(L->base) && cdataisv(cdataV(L->base)))) {
    sz = cdatavlen(cdataV(L->base));
  } else {
    CType *ct = lj_ctype_rawref(cts, id);
    if (ctype_isvltype(ct->info))
      sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
    else
      sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_INVALID;
    if (LJ_UNLIKELY(sz == CTSIZE_INVALID)) {
      setnilV(L->top-1);
      return 1;
    }
  }
  setintV(L->top-1, (int32_t)sz);
  return 1;
}